

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int yaml_parser_append_tag_directive
              (yaml_parser_t *parser,yaml_tag_directive_t value,int allow_duplicates,
              yaml_mark_t mark)

{
  yaml_tag_directive_t **top;
  yaml_tag_directive_t *pyVar1;
  int iVar2;
  yaml_char_t *ptr;
  yaml_char_t *ptr_00;
  yaml_tag_directive_t *pyVar3;
  
  pyVar3 = (parser->tag_directives).start;
  pyVar1 = (parser->tag_directives).top;
  do {
    if (pyVar3 == pyVar1) {
      ptr = yaml_strdup(value.handle);
      ptr_00 = yaml_strdup(value.prefix);
      if ((ptr_00 == (yaml_char_t *)0x0 || ptr == (yaml_char_t *)0x0) ||
         ((top = &(parser->tag_directives).top,
          (parser->tag_directives).top == (parser->tag_directives).end &&
          (iVar2 = yaml_stack_extend(&(parser->tag_directives).start,top,
                                     &(parser->tag_directives).end), iVar2 == 0)))) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_free(ptr);
        yaml_free(ptr_00);
LAB_00108725:
        iVar2 = 0;
      }
      else {
        pyVar3 = *top;
        *top = pyVar3 + 1;
        pyVar3->handle = ptr;
        pyVar3->prefix = ptr_00;
        iVar2 = 1;
      }
      return iVar2;
    }
    iVar2 = strcmp((char *)value.handle,(char *)pyVar3->handle);
    if (iVar2 == 0) {
      if (allow_duplicates != 0) {
        return 1;
      }
      parser->error = YAML_PARSER_ERROR;
      parser->problem = "found duplicate %TAG directive";
      (parser->problem_mark).index = mark.index;
      (parser->problem_mark).line = mark.line;
      (parser->problem_mark).column = mark.column;
      goto LAB_00108725;
    }
    pyVar3 = pyVar3 + 1;
  } while( true );
}

Assistant:

static int
yaml_parser_append_tag_directive(yaml_parser_t *parser,
        yaml_tag_directive_t value, int allow_duplicates, yaml_mark_t mark)
{
    yaml_tag_directive_t *tag_directive;
    yaml_tag_directive_t copy = { NULL, NULL };

    for (tag_directive = parser->tag_directives.start;
            tag_directive != parser->tag_directives.top; tag_directive ++) {
        if (strcmp((char *)value.handle, (char *)tag_directive->handle) == 0) {
            if (allow_duplicates)
                return 1;
            return yaml_parser_set_parser_error(parser,
                    "found duplicate %TAG directive", mark);
        }
    }

    copy.handle = yaml_strdup(value.handle);
    copy.prefix = yaml_strdup(value.prefix);
    if (!copy.handle || !copy.prefix) {
        parser->error = YAML_MEMORY_ERROR;
        goto error;
    }

    if (!PUSH(parser, parser->tag_directives, copy))
        goto error;

    return 1;

error:
    yaml_free(copy.handle);
    yaml_free(copy.prefix);
    return 0;
}